

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codecvt.cpp
# Opt level: O0

void test_codecvt_in_n_m(cvt_type *cvt,int n,int m)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  void *this;
  undefined8 uVar4;
  runtime_error *this_00;
  int iVar5;
  int in_EDX;
  int in_ESI;
  int count;
  result r;
  mbstate_t mb2;
  wchar_t *to_next;
  wchar_t *to_end;
  wchar_t *to;
  wchar_t buf [128];
  mbstate_t mb;
  char *from_next;
  char *real_end;
  char *end;
  char *from;
  int u8len;
  int wlen;
  wchar_t *wptr;
  wchar_t *__end;
  wchar_t **__from;
  state_type *in_stack_fffffffffffffc28;
  runtime_error *in_stack_fffffffffffffc30;
  extern_type *in_stack_fffffffffffffc38;
  allocator *paVar6;
  extern_type *in_stack_fffffffffffffc40;
  state_type *in_stack_fffffffffffffc48;
  __codecvt_abstract_base<wchar_t,_char,___mbstate_t> *in_stack_fffffffffffffc50;
  intern_type *in_stack_fffffffffffffc60;
  intern_type **in_stack_fffffffffffffc68;
  allocator local_369;
  string local_368 [38];
  undefined1 local_342;
  allocator local_341;
  string local_340 [38];
  undefined1 local_31a;
  allocator local_319;
  string local_318 [38];
  undefined1 local_2f2;
  allocator local_2f1;
  string local_2f0 [38];
  undefined1 local_2ca;
  allocator local_2c9;
  string local_2c8 [35];
  undefined1 local_2a5;
  allocator local_291;
  string local_290 [32];
  int local_270;
  result local_26c;
  long local_268;
  wchar_t *local_260;
  wchar_t *local_258;
  wchar_t *local_250;
  wchar_t local_248 [128];
  long local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  int local_20;
  int local_1c;
  wchar_t *local_18;
  int local_10;
  int local_c;
  
  local_18 = wide_name;
  local_10 = in_EDX;
  local_c = in_ESI;
  sVar2 = wcslen(wide_name);
  local_1c = (int)sVar2;
  sVar2 = strlen(utf8_name);
  local_20 = (int)sVar2;
  local_28 = utf8_name;
  local_30 = utf8_name;
  local_38 = utf8_name + local_20;
  local_40 = utf8_name;
  memset(&local_48,0,8);
  do {
    if (local_38 <= local_40) {
      test_counter = test_counter + 1;
      if (local_18 != wide_name + local_1c) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x59);
        poVar3 = std::operator<<(poVar3," wptr == wide_name + wlen");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        iVar5 = error_counter + 1;
        bVar1 = -1 < error_counter;
        error_counter = iVar5;
        if (bVar1) {
          local_342 = 1;
          uVar4 = __cxa_allocate_exception(0x30);
          paVar6 = &local_341;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_340,"Error limits reached, stopping unit test",paVar6);
          booster::runtime_error::runtime_error
                    (in_stack_fffffffffffffc30,(string *)in_stack_fffffffffffffc28);
          local_342 = 0;
          __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                     );
        }
      }
      test_counter = test_counter + 1;
      if (local_28 != local_38) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x5a);
        poVar3 = std::operator<<(poVar3," from == real_end");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        iVar5 = error_counter + 1;
        bVar1 = -1 < error_counter;
        error_counter = iVar5;
        if (bVar1) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
          paVar6 = &local_369;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_368,"Error limits reached, stopping unit test",paVar6);
          booster::runtime_error::runtime_error(this_00,(string *)in_stack_fffffffffffffc28);
          __cxa_throw(this_00,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      return;
    }
    if ((local_28 == local_30) && (local_30 = local_28 + local_c, local_38 < local_30)) {
      local_30 = local_38;
    }
    local_260 = local_248;
    __end = local_260 + local_10;
    local_268 = local_48;
    __from = &local_260;
    local_258 = __end;
    local_250 = local_260;
    local_26c = std::__codecvt_abstract_base<wchar_t,_char,___mbstate_t>::in
                          (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                           in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                           (extern_type **)in_stack_fffffffffffffc30,
                           &in_stack_fffffffffffffc28->__count,in_stack_fffffffffffffc60,
                           in_stack_fffffffffffffc68);
    local_270 = std::__codecvt_abstract_base<wchar_t,_char,___mbstate_t>::length
                          ((__codecvt_abstract_base<wchar_t,_char,___mbstate_t> *)
                           in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,(extern_type *)__from
                           ,(extern_type *)__end,0x106696);
    test_counter = test_counter + 1;
    if (local_48 != local_268) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x40);
      poVar3 = std::operator<<(poVar3," memcmp(&mb,&mb2,sizeof(mb))==0");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      iVar5 = error_counter + 1;
      bVar1 = -1 < error_counter;
      error_counter = iVar5;
      if (bVar1) {
        local_2a5 = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_290,"Error limits reached, stopping unit test",&local_291);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffffc30,(string *)in_stack_fffffffffffffc28);
        local_2a5 = 0;
        __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    if ((long)local_270 != (long)local_40 - (long)local_28) {
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,local_270);
      poVar3 = std::operator<<(poVar3," ");
      this = (void *)std::ostream::operator<<(poVar3,(long)local_40 - (long)local_28);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    test_counter = test_counter + 1;
    if ((long)local_270 != (long)local_40 - (long)local_28) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x44);
      poVar3 = std::operator<<(poVar3," count == from_next - from");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      iVar5 = error_counter + 1;
      bVar1 = -1 < error_counter;
      error_counter = iVar5;
      if (bVar1) {
        local_2ca = 1;
        uVar4 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2c8,"Error limits reached, stopping unit test",&local_2c9);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffffc30,(string *)in_stack_fffffffffffffc28);
        local_2ca = 0;
        __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    if (local_26c == partial) {
      local_30 = local_30 + local_c;
      if (local_38 < local_30) {
        local_30 = local_38;
      }
    }
    else {
      test_counter = test_counter + 1;
      if (local_26c != ok) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x50);
        poVar3 = std::operator<<(poVar3," r == cvt_type::ok");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        iVar5 = error_counter + 1;
        bVar1 = -1 < error_counter;
        error_counter = iVar5;
        if (bVar1) {
          local_2f2 = 1;
          uVar4 = __cxa_allocate_exception(0x30);
          paVar6 = &local_2f1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2f0,"Error limits reached, stopping unit test",paVar6);
          booster::runtime_error::runtime_error
                    (in_stack_fffffffffffffc30,(string *)in_stack_fffffffffffffc28);
          local_2f2 = 0;
          __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                     );
        }
      }
    }
    for (; local_250 != local_260; local_250 = local_250 + 1) {
      test_counter = test_counter + 1;
      if (*local_18 != *local_250) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x52);
        poVar3 = std::operator<<(poVar3," *wptr == *to");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        iVar5 = error_counter + 1;
        bVar1 = -1 < error_counter;
        error_counter = iVar5;
        if (bVar1) {
          local_31a = 1;
          uVar4 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_318,"Error limits reached, stopping unit test",&local_319);
          booster::runtime_error::runtime_error
                    (in_stack_fffffffffffffc30,(string *)in_stack_fffffffffffffc28);
          local_31a = 0;
          __cxa_throw(uVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error
                     );
        }
      }
      local_18 = local_18 + 1;
    }
    local_250 = local_260;
    local_28 = local_40;
  } while( true );
}

Assistant:

void test_codecvt_in_n_m(cvt_type const &cvt,int n,int m)
{
    wchar_t const *wptr = wide_name;
    int wlen = wcslen(wide_name);
    int u8len = strlen(utf8_name);
    char const *from = utf8_name;
    char const *end = from;
    char const *real_end = utf8_name + u8len;
    char const *from_next = from;
    std::mbstate_t mb=std::mbstate_t();
    while(from_next < real_end) {
        if(from == end) {
            end = from + n;
            if(end > real_end)
                end = real_end;
        }
        
        wchar_t buf[128];
        wchar_t *to = buf;
        wchar_t *to_end = to + m;
        wchar_t *to_next = to;
        
        
        std::mbstate_t mb2 = mb;
        std::codecvt_base::result r = cvt.in(mb,from,end,from_next,to,to_end,to_next);
        //std::cout << "In from_size=" << (end-from) << " from move=" <<  (from_next - from) << " to move= " << to_next - to << " state = " << res(r) << std::endl;
       
        int count = cvt.length(mb2,from,end,to_end - to);
        #ifndef BOOSTER_LOCALE_DO_LENGTH_MBSTATE_CONST
        TEST(memcmp(&mb,&mb2,sizeof(mb))==0);
        if(count != from_next - from) {
            std::cout << count << " " << from_next - from << std::endl;
        }
        TEST(count == from_next - from);
        #else
        TEST(count == to_next - to);
        #endif

        
        if(r == cvt_type::partial) {
            end+=n;
            if(end > real_end)
                end = real_end;
        }
        else
            TEST(r == cvt_type::ok);
        while(to!=to_next) {
            TEST(*wptr == *to);
            wptr++;
            to++;
        }
        to=to_next;
        from = from_next;
    }
    TEST(wptr == wide_name + wlen);
    TEST(from == real_end);
    
}